

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

ssize_t google::ReadFromOffset(int fd,void *buf,size_t count,size_t offset)

{
  long lVar1;
  int *piVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  
  if ((-1 < fd) && (-1 < (long)count)) {
    uVar4 = 0;
    do {
      if (count < uVar4 || count - uVar4 == 0) goto LAB_0011d171;
      while (lVar1 = pread(fd,(void *)((long)buf + uVar4),count - uVar4,uVar4 + offset), lVar1 == -1
            ) {
        piVar2 = __errno_location();
        if (*piVar2 != 4) goto LAB_0011d17e;
      }
      bVar5 = lVar1 < 0;
      cVar3 = (lVar1 == 0) * '\x03';
      if (lVar1 < 1) {
        lVar1 = 0;
      }
      if (bVar5) {
        cVar3 = '\x01';
      }
      uVar4 = uVar4 + lVar1;
    } while (cVar3 == '\0');
    if (cVar3 == '\x03') {
LAB_0011d171:
      if (count < uVar4) goto LAB_0011d179;
    }
    else {
LAB_0011d17e:
      uVar4 = 0xffffffffffffffff;
    }
    return uVar4;
  }
LAB_0011d179:
  abort();
}

Assistant:

static ssize_t ReadFromOffset(const int fd, void* buf, const size_t count,
                              const size_t offset) {
  GLOG_SAFE_ASSERT(fd >= 0);
  GLOG_SAFE_ASSERT(count <=
                   static_cast<size_t>(std::numeric_limits<ssize_t>::max()));
  char* buf0 = reinterpret_cast<char*>(buf);
  size_t num_bytes = 0;
  while (num_bytes < count) {
    ssize_t len = FailureRetry([fd, p = buf0 + num_bytes, n = count - num_bytes,
                                m = static_cast<off_t>(offset + num_bytes)] {
      return pread(fd, p, n, m);
    });
    if (len < 0) {  // There was an error other than EINTR.
      return -1;
    }
    if (len == 0) {  // Reached EOF.
      break;
    }
    num_bytes += static_cast<size_t>(len);
  }
  GLOG_SAFE_ASSERT(num_bytes <= count);
  return static_cast<ssize_t>(num_bytes);
}